

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O1

void __thiscall
BailOutRecord::RestoreValues
          (BailOutRecord *this,BailOutKind bailOutKind,JavascriptCallStackLayout *layout,uint count,
          int *offsets,int argOutSlotStart,Var *values,ScriptContext *scriptContext,
          bool fromLoopBody,Var *registerSaves,InterpreterStackFrame *newInstance,
          Var *pArgumentsObject,void *argoutRestoreAddress)

{
  int offset;
  uint uVar1;
  GlobalBailOutRecordDataTable *pGVar2;
  GlobalBailOutRecordDataRow *pGVar3;
  code *pcVar4;
  byte bVar5;
  bool bVar6;
  undefined4 *puVar7;
  ulong uVar8;
  long lVar9;
  bool local_32;
  bool local_31 [7];
  bool isFloat64;
  bool isInt32;
  
  if (offsets == (int *)0x0) {
    pGVar2 = this->globalBailOutRecordTable;
    if (pGVar2->length != 0) {
      uVar1 = this->m_bailOutRecordId;
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      lVar9 = 0;
      uVar8 = 0;
      do {
        pGVar3 = pGVar2->globalBailOutRecordDataRows;
        if (uVar1 <= *(uint *)((long)&pGVar3->end + lVar9)) {
          if (uVar1 < *(uint *)((long)&pGVar3->start + lVar9)) {
            return;
          }
          if (*(int *)((long)&pGVar3->offset + lVar9) == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar7 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                               ,0x411,"(row->offset != 0)","row->offset != 0");
            if (!bVar6) {
              pcVar4 = (code *)invalidInstructionException();
              (*pcVar4)();
            }
            *puVar7 = 0;
          }
          bVar5 = (byte)(*(uint *)(&pGVar3->field_0xc + lVar9) >> 0x18);
          RestoreValue(this,bailOutKind,layout,values,scriptContext,fromLoopBody,registerSaves,
                       newInstance,pArgumentsObject,argoutRestoreAddress,
                       *(uint *)(&pGVar3->field_0xc + lVar9) & 0x3fffffff,
                       *(int *)((long)&pGVar3->offset + lVar9),true,(bool)(bVar5 >> 6 & 1),
                       (bool)(bVar5 >> 7));
        }
        uVar8 = uVar8 + 1;
        lVar9 = lVar9 + 0x10;
      } while (uVar8 < pGVar2->length);
    }
  }
  else if (count != 0) {
    uVar8 = 0;
    do {
      offset = offsets[uVar8];
      IsOffsetNativeIntOrFloat(this,(uint)uVar8,argOutSlotStart,&local_32,local_31);
      RestoreValue(this,bailOutKind,layout,values,scriptContext,fromLoopBody,registerSaves,
                   newInstance,pArgumentsObject,argoutRestoreAddress,(uint)uVar8,offset,false,
                   local_32,local_31[0]);
      uVar8 = uVar8 + 1;
    } while (count != uVar8);
  }
  return;
}

Assistant:

void
BailOutRecord::RestoreValues(IR::BailOutKind bailOutKind, Js::JavascriptCallStackLayout * layout, uint count, __in_ecount_opt(count) int * offsets, int argOutSlotStart,
    __out_ecount(count) Js::Var * values, Js::ScriptContext * scriptContext,
    bool fromLoopBody, Js::Var * registerSaves, Js::InterpreterStackFrame * newInstance, Js::Var* pArgumentsObject, void * argoutRestoreAddress) const
{
    bool isLocal = offsets == nullptr;

    if (isLocal == true)
    {
        globalBailOutRecordTable->IterateGlobalBailOutRecordTableRows(m_bailOutRecordId, [=](GlobalBailOutRecordDataRow *row) {
            Assert(row->offset != 0);
            RestoreValue(bailOutKind, layout, values, scriptContext, fromLoopBody, registerSaves, newInstance, pArgumentsObject,
                argoutRestoreAddress, row->regSlot, row->offset, true, row->isFloat, row->isInt);
        });
    }
    else
    {
        for (uint i = 0; i < count; i++)
        {
            int offset = 0;

            // The variables below determine whether we have a Var or native float/int.
            bool isFloat64;
            bool isInt32;

            offset = offsets[i];
            this->IsOffsetNativeIntOrFloat(i, argOutSlotStart, &isFloat64, &isInt32);
#ifdef _M_IX86
            if (this->argOutOffsetInfo->isOrphanedArgSlot->Test(argOutSlotStart + i))
            {
                RestoreValue(bailOutKind, layout, values, scriptContext, fromLoopBody, registerSaves, newInstance, pArgumentsObject,
                    nullptr, i, offset, /* isLocal */ true, isFloat64, isInt32);
                continue;
            }
#endif
            RestoreValue(bailOutKind, layout, values, scriptContext, fromLoopBody, registerSaves, newInstance, pArgumentsObject,
                         argoutRestoreAddress, i, offset, false, isFloat64, isInt32);
        }
    }
}